

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O2

void __thiscall
nlohmann::json_abi_v3_11_2::detail::
serializer<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
::dump(serializer<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
       *this,basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             *val,bool pretty_print,bool ensure_ascii,uint indent_step,uint current_indent)

{
  _func_int **pp_Var1;
  pointer pbVar2;
  pointer puVar3;
  ulong uVar4;
  string_t *psVar5;
  binary_t *pbVar6;
  _Rb_tree_node_base *p_Var7;
  uchar *puVar8;
  _func_int *UNRECOVERED_JUMPTABLE_00;
  char *pcVar9;
  pointer pcVar10;
  element_type *peVar11;
  size_t cnt;
  pointer puVar12;
  pointer pbVar13;
  ulong uVar14;
  const_iterator i;
  uchar *puVar15;
  uint uVar16;
  undefined8 uStack_50;
  
  if (discarded < val->m_type) {
    return;
  }
  switch(val->m_type) {
  case null:
    peVar11 = (this->o).
              super___shared_ptr<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    UNRECOVERED_JUMPTABLE_00 = peVar11->_vptr_output_adapter_protocol[1];
    pcVar9 = "null";
    break;
  case object:
    peVar11 = (this->o).
              super___shared_ptr<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    pp_Var1 = peVar11->_vptr_output_adapter_protocol;
    if ((((val->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) {
      UNRECOVERED_JUMPTABLE_00 = pp_Var1[1];
      pcVar9 = "{}";
      goto LAB_0010a8c5;
    }
    if (pretty_print) {
      (*pp_Var1[1])(peVar11,"{\n",2);
      uVar16 = indent_step + current_indent;
      uVar4 = (this->indent_string)._M_string_length;
      if (uVar4 < uVar16) {
        std::__cxx11::string::resize((ulong)&this->indent_string,(char)uVar4 * '\x02');
      }
      pbVar6 = (val->m_value).binary;
      p_Var7 = (_Rb_tree_node_base *)pbVar6->m_subtype;
      puVar12 = (pointer)0x0;
      while( true ) {
        puVar3 = pbVar6[1].super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        peVar11 = (this->o).
                  super___shared_ptr<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        (*peVar11->_vptr_output_adapter_protocol[1])
                  (peVar11,(this->indent_string)._M_dataplus._M_p,(ulong)uVar16);
        peVar11 = (this->o).
                  super___shared_ptr<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        (**peVar11->_vptr_output_adapter_protocol)(peVar11,0x22);
        dump_escaped(this,(string_t *)(p_Var7 + 1),ensure_ascii);
        peVar11 = (this->o).
                  super___shared_ptr<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        (*peVar11->_vptr_output_adapter_protocol[1])(peVar11,"\": ",3);
        dump(this,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)(p_Var7 + 2),true,ensure_ascii,indent_step,uVar16);
        peVar11 = (this->o).
                  super___shared_ptr<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        if (puVar3 + -1 <= puVar12) break;
        (*peVar11->_vptr_output_adapter_protocol[1])(peVar11,",\n",2);
        puVar12 = puVar12 + 1;
        p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
        pbVar6 = (binary_t *)(val->m_value).object;
      }
      (**peVar11->_vptr_output_adapter_protocol)(peVar11,10);
      peVar11 = (this->o).
                super___shared_ptr<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      pcVar10 = (this->indent_string)._M_dataplus._M_p;
      goto LAB_0010aae1;
    }
    (**pp_Var1)(peVar11,0x7b);
    pbVar6 = (val->m_value).binary;
    p_Var7 = (_Rb_tree_node_base *)pbVar6->m_subtype;
    puVar12 = (pointer)0x0;
    while( true ) {
      puVar3 = pbVar6[1].super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      peVar11 = (this->o).
                super___shared_ptr<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      (**peVar11->_vptr_output_adapter_protocol)(peVar11,0x22);
      dump_escaped(this,(string_t *)(p_Var7 + 1),ensure_ascii);
      peVar11 = (this->o).
                super___shared_ptr<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      (*peVar11->_vptr_output_adapter_protocol[1])(peVar11,"\":",2);
      dump(this,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)(p_Var7 + 2),false,ensure_ascii,indent_step,current_indent);
      peVar11 = (this->o).
                super___shared_ptr<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      UNRECOVERED_JUMPTABLE_00 = *peVar11->_vptr_output_adapter_protocol;
      if (puVar3 + -1 <= puVar12) break;
      (*UNRECOVERED_JUMPTABLE_00)(peVar11,0x2c);
      puVar12 = puVar12 + 1;
      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
      pbVar6 = (binary_t *)(val->m_value).object;
    }
    goto LAB_0010aaf0;
  case array:
    peVar11 = (this->o).
              super___shared_ptr<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    pp_Var1 = peVar11->_vptr_output_adapter_protocol;
    if ((((val->m_value).array)->
        super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start !=
        (((val->m_value).array)->
        super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      if (pretty_print) {
        (*pp_Var1[1])(peVar11,"[\n",2);
        uVar16 = current_indent + indent_step;
        uVar4 = (this->indent_string)._M_string_length;
        if (uVar4 < uVar16) {
          std::__cxx11::string::resize((ulong)&this->indent_string,(char)uVar4 * '\x02');
        }
        psVar5 = (string_t *)(val->m_value).array;
        for (pbVar13 = (((_Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                          *)&psVar5->_M_dataplus)->_M_impl).super__Vector_impl_data._M_start;
            pbVar2 = (pointer)psVar5->_M_string_length,
            peVar11 = (this->o).
                      super___shared_ptr<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,
            (*peVar11->_vptr_output_adapter_protocol[1])
                      (peVar11,(this->indent_string)._M_dataplus._M_p,(ulong)uVar16),
            pbVar13 != pbVar2 + -1; pbVar13 = pbVar13 + 1) {
          dump(this,pbVar13,true,ensure_ascii,indent_step,uVar16);
          peVar11 = (this->o).
                    super___shared_ptr<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
          (*peVar11->_vptr_output_adapter_protocol[1])(peVar11,",\n",2);
          psVar5 = (val->m_value).string;
        }
        dump(this,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)(((val->m_value).string)->_M_string_length - 0x10),true,ensure_ascii,
             indent_step,uVar16);
        peVar11 = (this->o).
                  super___shared_ptr<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        (**peVar11->_vptr_output_adapter_protocol)(peVar11,10);
        peVar11 = (this->o).
                  super___shared_ptr<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        (*peVar11->_vptr_output_adapter_protocol[1])
                  (peVar11,(this->indent_string)._M_dataplus._M_p,(ulong)current_indent);
      }
      else {
        (**pp_Var1)(peVar11,0x5b);
        psVar5 = (string_t *)(val->m_value).array;
        for (pbVar13 = (((_Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                          *)&psVar5->_M_dataplus)->_M_impl).super__Vector_impl_data._M_start;
            pbVar13 != (pointer)psVar5->_M_string_length + -1; pbVar13 = pbVar13 + 1) {
          dump(this,pbVar13,false,ensure_ascii,indent_step,current_indent);
          peVar11 = (this->o).
                    super___shared_ptr<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
          (**peVar11->_vptr_output_adapter_protocol)(peVar11,0x2c);
          psVar5 = (val->m_value).string;
        }
        dump(this,(pointer)psVar5->_M_string_length + -1,false,ensure_ascii,indent_step,
             current_indent);
      }
      peVar11 = (this->o).
                super___shared_ptr<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      UNRECOVERED_JUMPTABLE_00 = *peVar11->_vptr_output_adapter_protocol;
      uStack_50 = 0x5d;
      goto LAB_0010aaf3;
    }
    UNRECOVERED_JUMPTABLE_00 = pp_Var1[1];
    pcVar9 = "[]";
LAB_0010a8c5:
    uStack_50 = 2;
    goto LAB_0010ab16;
  case string:
    peVar11 = (this->o).
              super___shared_ptr<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    (**peVar11->_vptr_output_adapter_protocol)(peVar11,0x22);
    dump_escaped(this,(string_t *)(val->m_value).object,ensure_ascii);
    peVar11 = (this->o).
              super___shared_ptr<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    UNRECOVERED_JUMPTABLE_00 = *peVar11->_vptr_output_adapter_protocol;
    uStack_50 = 0x22;
    goto LAB_0010aaf3;
  case boolean:
    peVar11 = (this->o).
              super___shared_ptr<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    UNRECOVERED_JUMPTABLE_00 = peVar11->_vptr_output_adapter_protocol[1];
    if ((val->m_value).boolean != true) {
      pcVar9 = "false";
LAB_0010ab14:
      uStack_50 = 5;
      goto LAB_0010ab16;
    }
    pcVar9 = "true";
    break;
  case number_integer:
    dump_integer<long,_0>(this,(val->m_value).number_integer);
    return;
  case number_unsigned:
    dump_integer<unsigned_long,_0>(this,(val->m_value).number_unsigned);
    return;
  case number_float:
    dump_float(this,(val->m_value).number_float);
    return;
  case binary:
    peVar11 = (this->o).
              super___shared_ptr<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    if (pretty_print) {
      (*peVar11->_vptr_output_adapter_protocol[1])(peVar11,"{\n",2);
      uVar14 = (ulong)(indent_step + current_indent);
      uVar4 = (this->indent_string)._M_string_length;
      if (uVar4 < uVar14) {
        std::__cxx11::string::resize((ulong)&this->indent_string,(char)uVar4 * '\x02');
      }
      peVar11 = (this->o).
                super___shared_ptr<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      (*peVar11->_vptr_output_adapter_protocol[1])
                (peVar11,(this->indent_string)._M_dataplus._M_p,uVar14);
      peVar11 = (this->o).
                super___shared_ptr<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      (*peVar11->_vptr_output_adapter_protocol[1])(peVar11,"\"bytes\": [",10);
      puVar15 = (((val->m_value).binary)->
                super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar8 = (((val->m_value).binary)->super_vector<unsigned_char,_std::allocator<unsigned_char>_>
               ).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (puVar15 != puVar8) {
        for (; puVar15 != puVar8 + -1; puVar15 = puVar15 + 1) {
          dump_integer<unsigned_char,_0>(this,*puVar15);
          peVar11 = (this->o).
                    super___shared_ptr<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
          (*peVar11->_vptr_output_adapter_protocol[1])(peVar11,", ",2);
          puVar8 = (uchar *)((val->m_value).string)->_M_string_length;
        }
        dump_integer<unsigned_char,_0>(this,puVar8[-1]);
      }
      peVar11 = (this->o).
                super___shared_ptr<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      (*peVar11->_vptr_output_adapter_protocol[1])(peVar11,"],\n",3);
      peVar11 = (this->o).
                super___shared_ptr<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      (*peVar11->_vptr_output_adapter_protocol[1])
                (peVar11,(this->indent_string)._M_dataplus._M_p,uVar14);
      peVar11 = (this->o).
                super___shared_ptr<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      (*peVar11->_vptr_output_adapter_protocol[1])(peVar11,"\"subtype\": ",0xb);
      if (((val->m_value).binary)->m_has_subtype == true) {
        dump_integer<unsigned_long,_0>(this,((val->m_value).binary)->m_subtype);
      }
      else {
        peVar11 = (this->o).
                  super___shared_ptr<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        (*peVar11->_vptr_output_adapter_protocol[1])(peVar11,"null",4);
      }
      peVar11 = (this->o).
                super___shared_ptr<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      (**peVar11->_vptr_output_adapter_protocol)(peVar11,10);
      peVar11 = (this->o).
                super___shared_ptr<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      pcVar10 = (this->indent_string)._M_dataplus._M_p;
LAB_0010aae1:
      (*peVar11->_vptr_output_adapter_protocol[1])(peVar11,pcVar10,(ulong)current_indent);
    }
    else {
      (*peVar11->_vptr_output_adapter_protocol[1])(peVar11,"{\"bytes\":[",10);
      puVar15 = (((val->m_value).binary)->
                super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar8 = (((val->m_value).binary)->super_vector<unsigned_char,_std::allocator<unsigned_char>_>
               ).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (puVar15 != puVar8) {
        for (; puVar15 != puVar8 + -1; puVar15 = puVar15 + 1) {
          dump_integer<unsigned_char,_0>(this,*puVar15);
          peVar11 = (this->o).
                    super___shared_ptr<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
          (**peVar11->_vptr_output_adapter_protocol)(peVar11,0x2c);
          puVar8 = (uchar *)((val->m_value).string)->_M_string_length;
        }
        dump_integer<unsigned_char,_0>(this,puVar8[-1]);
      }
      peVar11 = (this->o).
                super___shared_ptr<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      (*peVar11->_vptr_output_adapter_protocol[1])(peVar11,"],\"subtype\":",0xc);
      if (((val->m_value).binary)->m_has_subtype != true) {
        peVar11 = (this->o).
                  super___shared_ptr<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        UNRECOVERED_JUMPTABLE_00 = peVar11->_vptr_output_adapter_protocol[1];
        pcVar9 = "null}";
        goto LAB_0010ab14;
      }
      dump_integer<unsigned_long,_0>(this,((val->m_value).binary)->m_subtype);
    }
    peVar11 = (this->o).
              super___shared_ptr<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    UNRECOVERED_JUMPTABLE_00 = *peVar11->_vptr_output_adapter_protocol;
LAB_0010aaf0:
    uStack_50 = 0x7d;
LAB_0010aaf3:
    (*UNRECOVERED_JUMPTABLE_00)(peVar11,uStack_50);
    return;
  case discarded:
    peVar11 = (this->o).
              super___shared_ptr<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    UNRECOVERED_JUMPTABLE_00 = peVar11->_vptr_output_adapter_protocol[1];
    pcVar9 = "<discarded>";
    uStack_50 = 0xb;
    goto LAB_0010ab16;
  }
  uStack_50 = 4;
LAB_0010ab16:
  (*UNRECOVERED_JUMPTABLE_00)(peVar11,pcVar9,uStack_50);
  return;
}

Assistant:

void dump(const BasicJsonType& val,
              const bool pretty_print,
              const bool ensure_ascii,
              const unsigned int indent_step,
              const unsigned int current_indent = 0)
    {
        switch (val.m_type)
        {
            case value_t::object:
            {
                if (val.m_value.object->empty())
                {
                    o->write_characters("{}", 2);
                    return;
                }

                if (pretty_print)
                {
                    o->write_characters("{\n", 2);

                    // variable to hold indentation for recursive calls
                    const auto new_indent = current_indent + indent_step;
                    if (JSON_HEDLEY_UNLIKELY(indent_string.size() < new_indent))
                    {
                        indent_string.resize(indent_string.size() * 2, ' ');
                    }

                    // first n-1 elements
                    auto i = val.m_value.object->cbegin();
                    for (std::size_t cnt = 0; cnt < val.m_value.object->size() - 1; ++cnt, ++i)
                    {
                        o->write_characters(indent_string.c_str(), new_indent);
                        o->write_character('\"');
                        dump_escaped(i->first, ensure_ascii);
                        o->write_characters("\": ", 3);
                        dump(i->second, true, ensure_ascii, indent_step, new_indent);
                        o->write_characters(",\n", 2);
                    }

                    // last element
                    JSON_ASSERT(i != val.m_value.object->cend());
                    JSON_ASSERT(std::next(i) == val.m_value.object->cend());
                    o->write_characters(indent_string.c_str(), new_indent);
                    o->write_character('\"');
                    dump_escaped(i->first, ensure_ascii);
                    o->write_characters("\": ", 3);
                    dump(i->second, true, ensure_ascii, indent_step, new_indent);

                    o->write_character('\n');
                    o->write_characters(indent_string.c_str(), current_indent);
                    o->write_character('}');
                }
                else
                {
                    o->write_character('{');

                    // first n-1 elements
                    auto i = val.m_value.object->cbegin();
                    for (std::size_t cnt = 0; cnt < val.m_value.object->size() - 1; ++cnt, ++i)
                    {
                        o->write_character('\"');
                        dump_escaped(i->first, ensure_ascii);
                        o->write_characters("\":", 2);
                        dump(i->second, false, ensure_ascii, indent_step, current_indent);
                        o->write_character(',');
                    }

                    // last element
                    JSON_ASSERT(i != val.m_value.object->cend());
                    JSON_ASSERT(std::next(i) == val.m_value.object->cend());
                    o->write_character('\"');
                    dump_escaped(i->first, ensure_ascii);
                    o->write_characters("\":", 2);
                    dump(i->second, false, ensure_ascii, indent_step, current_indent);

                    o->write_character('}');
                }

                return;
            }

            case value_t::array:
            {
                if (val.m_value.array->empty())
                {
                    o->write_characters("[]", 2);
                    return;
                }

                if (pretty_print)
                {
                    o->write_characters("[\n", 2);

                    // variable to hold indentation for recursive calls
                    const auto new_indent = current_indent + indent_step;
                    if (JSON_HEDLEY_UNLIKELY(indent_string.size() < new_indent))
                    {
                        indent_string.resize(indent_string.size() * 2, ' ');
                    }

                    // first n-1 elements
                    for (auto i = val.m_value.array->cbegin();
                            i != val.m_value.array->cend() - 1; ++i)
                    {
                        o->write_characters(indent_string.c_str(), new_indent);
                        dump(*i, true, ensure_ascii, indent_step, new_indent);
                        o->write_characters(",\n", 2);
                    }

                    // last element
                    JSON_ASSERT(!val.m_value.array->empty());
                    o->write_characters(indent_string.c_str(), new_indent);
                    dump(val.m_value.array->back(), true, ensure_ascii, indent_step, new_indent);

                    o->write_character('\n');
                    o->write_characters(indent_string.c_str(), current_indent);
                    o->write_character(']');
                }
                else
                {
                    o->write_character('[');

                    // first n-1 elements
                    for (auto i = val.m_value.array->cbegin();
                            i != val.m_value.array->cend() - 1; ++i)
                    {
                        dump(*i, false, ensure_ascii, indent_step, current_indent);
                        o->write_character(',');
                    }

                    // last element
                    JSON_ASSERT(!val.m_value.array->empty());
                    dump(val.m_value.array->back(), false, ensure_ascii, indent_step, current_indent);

                    o->write_character(']');
                }

                return;
            }

            case value_t::string:
            {
                o->write_character('\"');
                dump_escaped(*val.m_value.string, ensure_ascii);
                o->write_character('\"');
                return;
            }

            case value_t::binary:
            {
                if (pretty_print)
                {
                    o->write_characters("{\n", 2);

                    // variable to hold indentation for recursive calls
                    const auto new_indent = current_indent + indent_step;
                    if (JSON_HEDLEY_UNLIKELY(indent_string.size() < new_indent))
                    {
                        indent_string.resize(indent_string.size() * 2, ' ');
                    }

                    o->write_characters(indent_string.c_str(), new_indent);

                    o->write_characters("\"bytes\": [", 10);

                    if (!val.m_value.binary->empty())
                    {
                        for (auto i = val.m_value.binary->cbegin();
                                i != val.m_value.binary->cend() - 1; ++i)
                        {
                            dump_integer(*i);
                            o->write_characters(", ", 2);
                        }
                        dump_integer(val.m_value.binary->back());
                    }

                    o->write_characters("],\n", 3);
                    o->write_characters(indent_string.c_str(), new_indent);

                    o->write_characters("\"subtype\": ", 11);
                    if (val.m_value.binary->has_subtype())
                    {
                        dump_integer(val.m_value.binary->subtype());
                    }
                    else
                    {
                        o->write_characters("null", 4);
                    }
                    o->write_character('\n');
                    o->write_characters(indent_string.c_str(), current_indent);
                    o->write_character('}');
                }
                else
                {
                    o->write_characters("{\"bytes\":[", 10);

                    if (!val.m_value.binary->empty())
                    {
                        for (auto i = val.m_value.binary->cbegin();
                                i != val.m_value.binary->cend() - 1; ++i)
                        {
                            dump_integer(*i);
                            o->write_character(',');
                        }
                        dump_integer(val.m_value.binary->back());
                    }

                    o->write_characters("],\"subtype\":", 12);
                    if (val.m_value.binary->has_subtype())
                    {
                        dump_integer(val.m_value.binary->subtype());
                        o->write_character('}');
                    }
                    else
                    {
                        o->write_characters("null}", 5);
                    }
                }
                return;
            }

            case value_t::boolean:
            {
                if (val.m_value.boolean)
                {
                    o->write_characters("true", 4);
                }
                else
                {
                    o->write_characters("false", 5);
                }
                return;
            }

            case value_t::number_integer:
            {
                dump_integer(val.m_value.number_integer);
                return;
            }

            case value_t::number_unsigned:
            {
                dump_integer(val.m_value.number_unsigned);
                return;
            }

            case value_t::number_float:
            {
                dump_float(val.m_value.number_float);
                return;
            }

            case value_t::discarded:
            {
                o->write_characters("<discarded>", 11);
                return;
            }

            case value_t::null:
            {
                o->write_characters("null", 4);
                return;
            }

            default:            // LCOV_EXCL_LINE
                JSON_ASSERT(false); // NOLINT(cert-dcl03-c,hicpp-static-assert,misc-static-assert) LCOV_EXCL_LINE
        }
    }